

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiTextFilter::Build(ImGuiTextFilter *this)

{
  bool bVar1;
  size_t sVar2;
  ImGuiTextRange *pIVar3;
  ImVector<ImGuiTextFilter::ImGuiTextRange> *in_RDI;
  ImGuiTextRange *f;
  int i;
  ImGuiTextRange input_range;
  int in_stack_ffffffffffffffcc;
  int local_1c;
  ImGuiTextRange local_18;
  
  ImVector<ImGuiTextFilter::ImGuiTextRange>::resize(in_RDI,in_stack_ffffffffffffffcc);
  sVar2 = strlen((char *)in_RDI);
  ImGuiTextRange::ImGuiTextRange(&local_18,(char *)in_RDI,(char *)((long)&in_RDI->Size + sVar2));
  ImGuiTextRange::split
            ((ImGuiTextRange *)input_range.b,i._3_1_,(ImVector<ImGuiTextFilter::ImGuiTextRange> *)f)
  ;
  in_RDI[0x11].Size = 0;
  for (local_1c = 0; local_1c != in_RDI[0x10].Size; local_1c = local_1c + 1) {
    pIVar3 = ImVector<ImGuiTextFilter::ImGuiTextRange>::operator[](in_RDI + 0x10,local_1c);
    while( true ) {
      bVar1 = false;
      if (pIVar3->b < pIVar3->e) {
        bVar1 = ImCharIsBlankA(*pIVar3->b);
      }
      if (bVar1 == false) break;
      pIVar3->b = pIVar3->b + 1;
    }
    while( true ) {
      bVar1 = false;
      if (pIVar3->b < pIVar3->e) {
        bVar1 = ImCharIsBlankA(pIVar3->e[-1]);
      }
      if (bVar1 == false) break;
      pIVar3->e = pIVar3->e + -1;
    }
    bVar1 = ImGuiTextRange::empty(pIVar3);
    if ((!bVar1) &&
       (pIVar3 = ImVector<ImGuiTextFilter::ImGuiTextRange>::operator[](in_RDI + 0x10,local_1c),
       *pIVar3->b != '-')) {
      in_RDI[0x11].Size = in_RDI[0x11].Size + 1;
    }
  }
  return;
}

Assistant:

void ImGuiTextFilter::Build()
{
    Filters.resize(0);
    ImGuiTextRange input_range(InputBuf, InputBuf + strlen(InputBuf));
    input_range.split(',', &Filters);

    CountGrep = 0;
    for (int i = 0; i != Filters.Size; i++)
    {
        ImGuiTextRange& f = Filters[i];
        while (f.b < f.e && ImCharIsBlankA(f.b[0]))
            f.b++;
        while (f.e > f.b && ImCharIsBlankA(f.e[-1]))
            f.e--;
        if (f.empty())
            continue;
        if (Filters[i].b[0] != '-')
            CountGrep += 1;
    }
}